

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statement.cpp
# Opt level: O0

TStatementPtr __thiscall SQLite::Statement::prepareStatement(Statement *this)

{
  sqlite3 *db;
  int ret_00;
  char *zSql;
  size_type sVar1;
  Exception *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  TStatementPtr TVar2;
  sqlite3_stmt *psStack_20;
  int ret;
  sqlite3_stmt *statement;
  Statement *this_local;
  
  db = (sqlite3 *)in_RSI[1]._M_dataplus._M_p;
  this_local = this;
  zSql = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                   (in_RSI);
  sVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    (in_RSI);
  ret_00 = sqlite3_prepare_v2(db,zSql,(int)sVar1,&stack0xffffffffffffffe0,(char **)0x0);
  if (ret_00 != 0) {
    this_00 = (Exception *)__cxa_allocate_exception(0x18);
    Exception::Exception(this_00,(sqlite3 *)in_RSI[1]._M_dataplus._M_p,ret_00);
    __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
  }
  std::shared_ptr<sqlite3_stmt>::
  shared_ptr<sqlite3_stmt,SQLite::Statement::prepareStatement()::__0,void>
            ((shared_ptr<sqlite3_stmt> *)this,psStack_20);
  TVar2.super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  TVar2.super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (TStatementPtr)TVar2.super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Statement::TStatementPtr Statement::prepareStatement()
{
    sqlite3_stmt* statement;
    const int ret = sqlite3_prepare_v2(mpSQLite, mQuery.c_str(), static_cast<int>(mQuery.size()), &statement, nullptr);
    if (SQLITE_OK != ret)
    {
        throw SQLite::Exception(mpSQLite, ret);
    }
    return Statement::TStatementPtr(statement, [](sqlite3_stmt* stmt)
        {
            sqlite3_finalize(stmt);
        });
}